

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> __thiscall
capnp::anon_unknown_34::BrokenClient::whenMoreResolved(BrokenClient *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX;
  long in_RSI;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> MVar1;
  void *local_1b0;
  Exception local_1a8;
  
  if (*(char *)(in_RSI + 0x1b0) == '\x01') {
    *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 0;
  }
  else {
    kj::Exception::Exception(&local_1a8,(Exception *)(in_RSI + 0x20));
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
              ((PromiseDisposer *)&local_1b0,&local_1a8);
    *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
    (this->super_ClientHook).brand = local_1b0;
    kj::Exception::~Exception(&local_1a8);
    in_RDX = extraout_RDX;
  }
  MVar1.ptr.field_1 = in_RDX;
  MVar1.ptr._0_8_ = this;
  return (Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>)MVar1.ptr;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    if (resolved) {
      return kj::none;
    } else {
      return kj::Promise<kj::Own<ClientHook>>(kj::cp(exception));
    }
  }